

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::utp_stream::
async_write_some<boost::asio::const_buffers_1,boost::asio::detail::write_op<libtorrent::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::utp_stream,boost::asio::ssl::detail::handshake_op,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>>>
          (utp_stream *this,const_buffers_1 *buffers,
          write_op<libtorrent::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_>
          *handler)

{
  io_context *piVar1;
  write_op<libtorrent::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_>
  *__f;
  bool bVar2;
  size_t sVar3;
  void *buf;
  unsigned_long local_250;
  error_code local_248;
  type local_238;
  const_buffer *local_198;
  const_buffer *end;
  const_buffer *i;
  size_t bytes_added;
  basic_errors local_174;
  type local_170;
  unsigned_long local_c8;
  basic_errors local_bc;
  type local_b8;
  write_op<libtorrent::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_>
  *local_20;
  write_op<libtorrent::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_>
  *handler_local;
  const_buffers_1 *buffers_local;
  utp_stream *this_local;
  
  local_20 = handler;
  handler_local =
       (write_op<libtorrent::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_>
        *)buffers;
  buffers_local = (const_buffers_1 *)this;
  if (this->m_impl == (utp_socket_impl *)0x0) {
    piVar1 = this->m_io_service;
    local_bc = not_connected;
    local_c8 = 0;
    std::
    bind<void,boost::asio::detail::write_op<libtorrent::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::utp_stream,boost::asio::ssl::detail::handshake_op,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>>const&,boost::asio::error::basic_errors,unsigned_long>
              (&local_b8,handler,&local_bc,&local_c8);
    boost::asio::io_context::
    post<std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::utp_stream,boost::asio::ssl::detail::handshake_op,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>>(boost::asio::error::basic_errors,unsigned_long)>>
              (piVar1,&local_b8);
    std::
    _Bind_result<void,_boost::asio::detail::write_op<libtorrent::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_>_(boost::asio::error::basic_errors,_unsigned_long)>
    ::~_Bind_result(&local_b8);
  }
  else {
    bVar2 = std::function::operator_cast_to_bool((function *)&this->m_write_handler);
    if (bVar2) {
      piVar1 = this->m_io_service;
      local_174 = operation_not_supported;
      bytes_added = 0;
      std::
      bind<void,boost::asio::detail::write_op<libtorrent::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::utp_stream,boost::asio::ssl::detail::handshake_op,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>>const&,boost::asio::error::basic_errors,unsigned_long>
                (&local_170,local_20,&local_174,&bytes_added);
      boost::asio::io_context::
      post<std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::utp_stream,boost::asio::ssl::detail::handshake_op,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>>(boost::asio::error::basic_errors,unsigned_long)>>
                (piVar1,&local_170);
      std::
      _Bind_result<void,_boost::asio::detail::write_op<libtorrent::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_>_(boost::asio::error::basic_errors,_unsigned_long)>
      ::~_Bind_result(&local_170);
    }
    else {
      i = (const_buffer *)0x0;
      end = boost::asio::buffer_sequence_begin<boost::asio::const_buffers_1>
                      ((const_buffers_1 *)handler_local,(type *)0x0);
      local_198 = boost::asio::buffer_sequence_end<boost::asio::const_buffers_1>
                            ((const_buffers_1 *)handler_local,(type *)0x0);
      for (; __f = local_20, end != local_198; end = end + 1) {
        sVar3 = boost::asio::buffer_size<boost::asio::const_buffer>(end);
        if (sVar3 != 0) {
          buf = boost::asio::buffer_cast<void_const*>(end);
          sVar3 = boost::asio::buffer_size<boost::asio::const_buffer>(end);
          add_write_buffer(this,buf,sVar3);
          sVar3 = boost::asio::buffer_size<boost::asio::const_buffer>(end);
          i = (const_buffer *)((long)&i->data_ + sVar3);
        }
      }
      if (i == (const_buffer *)0x0) {
        piVar1 = this->m_io_service;
        boost::system::error_code::error_code(&local_248);
        local_250 = 0;
        std::
        bind<void,boost::asio::detail::write_op<libtorrent::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::utp_stream,boost::asio::ssl::detail::handshake_op,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>>const&,boost::system::error_code,unsigned_long>
                  (&local_238,__f,&local_248,&local_250);
        boost::asio::io_context::
        post<std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::utp_stream,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,boost::asio::ssl::detail::io_op<libtorrent::utp_stream,boost::asio::ssl::detail::handshake_op,std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>>(boost::system::error_code,unsigned_long)>>
                  (piVar1,&local_238);
        std::
        _Bind_result<void,_boost::asio::detail::write_op<libtorrent::utp_stream,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_boost::asio::ssl::detail::io_op<libtorrent::utp_stream,_boost::asio::ssl::detail::handshake_op,_std::_Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>_>_>_(boost::system::error_code,_unsigned_long)>
        ::~_Bind_result(&local_238);
      }
      else {
        std::function<void(boost::system::error_code_const&,unsigned_long)>::operator=
                  ((function<void(boost::system::error_code_const&,unsigned_long)> *)
                   &this->m_write_handler,local_20);
        issue_write(this);
      }
    }
  }
  return;
}

Assistant:

void async_write_some(Const_Buffers const& buffers, Handler const& handler)
	{
		if (m_impl == nullptr)
		{
			m_io_service.post(std::bind<void>(handler
				, boost::asio::error::not_connected, std::size_t(0)));
			return;
		}

		TORRENT_ASSERT(!m_write_handler);
		if (m_write_handler)
		{
			m_io_service.post(std::bind<void>(handler
				, boost::asio::error::operation_not_supported, std::size_t(0)));
			return;
		}

		std::size_t bytes_added = 0;
#if BOOST_VERSION >= 106600
		for (auto i = buffer_sequence_begin(buffers)
			, end(buffer_sequence_end(buffers)); i != end; ++i)
#else
		for (typename Const_Buffers::const_iterator i = buffers.begin()
			, end(buffers.end()); i != end; ++i)
#endif
		{
			if (buffer_size(*i) == 0) continue;
			using boost::asio::buffer_cast;
			using boost::asio::buffer_size;
			add_write_buffer(buffer_cast<void const*>(*i), buffer_size(*i));
			bytes_added += buffer_size(*i);
		}
		if (bytes_added == 0)
		{
			// if we're writing 0 bytes, post handler immediately
			// asio's SSL layer depends on this behavior
			m_io_service.post(std::bind<void>(handler, error_code(), std::size_t(0)));
			return;
		}
		m_write_handler = handler;
		issue_write();
	}